

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

Symbol * addlnksymbol(GlobalVars *gv,char *name,lword val,uint8_t type,uint8_t flags,uint8_t info,
                     uint8_t bind,uint32_t size)

{
  void *pvVar1;
  unsigned_long uVar2;
  Symbol *pSVar3;
  uint8_t in_CL;
  lword in_RDX;
  char *in_RSI;
  long in_RDI;
  uint8_t in_R8B;
  uint8_t in_R9B;
  uint8_t in_stack_00000008;
  uint32_t in_stack_00000010;
  Symbol **chain;
  Symbol *sym;
  size_t size_00;
  long *local_30;
  
  if (*(long *)(in_RDI + 0x1a0) == 0) {
    pvVar1 = alloc_hashtable(0x114ef5);
    *(void **)(in_RDI + 0x1a0) = pvVar1;
  }
  size_00 = *(size_t *)(in_RDI + 0x1a0);
  uVar2 = elf_hash(in_RSI);
  for (local_30 = (long *)(size_00 + (uVar2 & 0xf) * 8); *local_30 != 0;
      local_30 = (long *)(*local_30 + 0x18)) {
  }
  pSVar3 = (Symbol *)alloczero(size_00);
  *local_30 = (long)pSVar3;
  pSVar3->name = in_RSI;
  pSVar3->value = in_RDX;
  pSVar3->type = in_CL;
  pSVar3->flags = in_R8B;
  pSVar3->info = in_R9B;
  pSVar3->bind = in_stack_00000008;
  pSVar3->size = in_stack_00000010;
  return pSVar3;
}

Assistant:

struct Symbol *addlnksymbol(struct GlobalVars *gv,const char *name,lword val,
                            uint8_t type,uint8_t flags,uint8_t info,
                            uint8_t bind,uint32_t size)
/* Define a new, target-specific, linker symbol. */
{
  struct Symbol *sym;
  struct Symbol **chain;

  if (gv->lnksyms == NULL)
    gv->lnksyms = alloc_hashtable(LNKSYMHTABSIZE);
  chain = &gv->lnksyms[elf_hash(name)%LNKSYMHTABSIZE];

  while (sym = *chain)
    chain = &sym->obj_chain;
  *chain = sym = alloczero(sizeof(struct Symbol));
  sym->name = name;
  sym->value = val;
  sym->type = type;
  sym->flags = flags;
  sym->info = info;
  sym->bind = bind;
  sym->size = size;
  return sym;
}